

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ImageDataParameter::Clear(ImageDataParameter *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  ImageDataParameter *local_60;
  ImageDataParameter *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_60 = this;
  if ((local_18->has_bits_[0] & 7) != 0) {
    bVar1 = has_source(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->source_,psVar2);
      local_99 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dbb);
        local_99 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_98,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_ad,pLVar3);
      }
      if ((local_99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_98);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->source_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_mean_file(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->mean_file_,psVar2);
      local_e9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dbf);
        local_e9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_e8,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_ea,pLVar3);
      }
      if ((local_e9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_e8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->mean_file_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_root_folder(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->root_folder_,psVar2);
      local_129 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dc3);
        local_129 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_128,
                            "CHECK failed: !root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_12a,pLVar3);
      }
      if ((local_129 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_128);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->root_folder_);
      std::__cxx11::string::clear();
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xf8) != 0) {
    memset(&this->crop_size_,0,0x10);
  }
  local_38 = &this->_has_bits_;
  local_3c = 0;
  if ((local_38->has_bits_[0] & 0xf00) != 0) {
    this->new_width_ = 0;
    this->is_color_ = true;
    this->scale_ = 1.0;
    this->batch_size_ = 1;
  }
  this_local = (ImageDataParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_50 = &this->_internal_metadata_;
  if (((uint)(local_50->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_48 = local_50;
    local_10 = local_50;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_50);
  }
  return;
}

Assistant:

void ImageDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ImageDataParameter)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
    if (has_root_folder()) {
      GOOGLE_DCHECK(!root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*root_folder_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 248u) {
    ::memset(&crop_size_, 0, reinterpret_cast<char*>(&new_height_) -
      reinterpret_cast<char*>(&crop_size_) + sizeof(new_height_));
  }
  if (_has_bits_[8 / 32] & 3840u) {
    new_width_ = 0u;
    is_color_ = true;
    scale_ = 1;
    batch_size_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}